

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O0

void __thiscall
gui::ColorPicker::handleMousePress(ColorPicker *this,Button button,Vector2f *mouseParent)

{
  ColorPicker *in_RDX;
  int in_ESI;
  Vector2f *in_RDI;
  Vector2f VVar1;
  Vector2f VVar2;
  Vector2f shadingRectangleSize;
  Vector2f mouseLocal;
  Widget *in_stack_ffffffffffffffd8;
  Vector2f *in_stack_ffffffffffffffe0;
  uint in_stack_fffffffffffffff0;
  
  Group::handleMousePress
            ((Group *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Button)((ulong)in_RDX >> 0x20),
             in_stack_ffffffffffffffe0);
  VVar1 = Widget::toLocalOriginSpace(in_stack_ffffffffffffffd8,in_RDI);
  VVar2 = getShadingRectangleSize(in_RDX);
  if ((((in_ESI == 0) && (((uint)in_RDI[0x7e].x & 1) == 0)) && (VVar1.x < VVar2.x)) &&
     (VVar1.y < VVar2.y)) {
    updateShadingRectangle
              ((ColorPicker *)(ulong)in_stack_fffffffffffffff0,(float)((ulong)in_RDX >> 0x20),
               SUB84(in_RDX,0));
    *(undefined1 *)&in_RDI[0x7e].x = 1;
  }
  return;
}

Assistant:

void ColorPicker::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    const auto shadingRectangleSize = getShadingRectangleSize();
    if (button == sf::Mouse::Left && !isDragging_ && mouseLocal.x < shadingRectangleSize.x && mouseLocal.y < shadingRectangleSize.y) {
        GUI_DEBUG << "ColorPicker::handleMousePress().\n";
        updateShadingRectangle(mouseLocal.x / shadingRectangleSize.x, 1.0f - mouseLocal.y / shadingRectangleSize.y);
        isDragging_ = true;
    }
}